

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemAloha.cpp
# Opt level: O2

string * __thiscall
ProblemAloha::SoftPrintBriefDescription_abi_cxx11_
          (string *__return_storage_ptr__,ProblemAloha *this)

{
  uint uVar1;
  ostream *poVar2;
  IslandConfiguration extraout_EDX;
  IslandConfiguration extraout_EDX_00;
  IslandConfiguration conf;
  stringstream ss;
  string sStack_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar2 = std::operator<<(local_198,"Aloha_");
  (**(code **)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                         super_MultiAgentDecisionProcessDiscreteFactoredStates.
                         super_MultiAgentDecisionProcess + 0x328))
            (&sStack_1c8,this,*(undefined4 *)&(this->super_FactoredDecPOMDPDiscrete).field_0x708);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_1c8);
  std::operator<<(poVar2,"_");
  std::__cxx11::string::~string((string *)&sStack_1c8);
  uVar1 = *(uint *)&(this->super_FactoredDecPOMDPDiscrete).field_0x704;
  conf = extraout_EDX;
  if (uVar1 == 0xb) {
    (**(code **)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                           super_MultiAgentDecisionProcessDiscreteFactoredStates.
                           super_MultiAgentDecisionProcess + 0x10))(this);
    std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    uVar1 = *(uint *)&(this->super_FactoredDecPOMDPDiscrete).field_0x704;
    conf = extraout_EDX_00;
  }
  IslandConfigToString_abi_cxx11_(&sStack_1c8,(ProblemAloha *)(ulong)uVar1,conf);
  poVar2 = std::operator<<(local_198,(string *)&sStack_1c8);
  poVar2 = std::operator<<(poVar2,"_maxBL");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string ProblemAloha::SoftPrintBriefDescription() const
{
    stringstream ss;
    ss << "Aloha_" << SoftPrintVariation(GetVariation())
       << "_";
    if(GetIslandConfiguration()==InLine)
        ss << GetNrAgents();
    ss << IslandConfigToString(GetIslandConfiguration()) << "_maxBL"
       << GetMaxBacklog();
    return ss.str();
}